

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeDriverGetLastErrorDescription(ze_driver_handle_t hDriver,char **ppString)

{
  ze_pfnDriverGetLastErrorDescription_t pfnGetLastErrorDescription;
  dditable_t *dditable;
  ze_result_t result;
  char **ppString_local;
  ze_driver_handle_t hDriver_local;
  
  if (*(code **)(*(long *)(hDriver + 8) + 200) == (code *)0x0) {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDriver_local._4_4_ =
         (**(code **)(*(long *)(hDriver + 8) + 200))(*(undefined8 *)hDriver,ppString);
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetLastErrorDescription(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        const char** ppString                           ///< [in,out] pointer to a null-terminated array of characters describing
                                                        ///< cause of error.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnGetLastErrorDescription = dditable->ze.Driver.pfnGetLastErrorDescription;
        if( nullptr == pfnGetLastErrorDescription )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGetLastErrorDescription( hDriver, ppString );

        return result;
    }